

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O3

REF_STATUS ref_part_meshb_size(FILE *file,REF_INT version,REF_SIZE *value)

{
  size_t sVar1;
  undefined8 uVar2;
  char *pcVar3;
  uint int_value;
  unsigned_long long_value;
  uint local_14;
  ulong local_10;
  
  if (version < 4) {
    sVar1 = fread(&local_14,4,1,(FILE *)file);
    if (sVar1 != 1) {
      pcVar3 = "int value";
      uVar2 = 0x38;
LAB_00195273:
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar2,
             "ref_part_meshb_size",pcVar3,1,sVar1);
      return 1;
    }
    local_10 = (ulong)local_14;
  }
  else {
    sVar1 = fread(&local_10,8,1,(FILE *)file);
    if (sVar1 != 1) {
      pcVar3 = "long value";
      uVar2 = 0x3b;
      goto LAB_00195273;
    }
  }
  *value = local_10;
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_part_meshb_size(FILE *file, REF_INT version,
                                              REF_SIZE *value) {
  unsigned int int_value;
  unsigned long long_value;
  if (version < 4) {
    REIS(1, fread(&int_value, sizeof(int), 1, file), "int value");
    *value = (REF_SIZE)int_value;
  } else {
    REIS(1, fread(&long_value, sizeof(long), 1, file), "long value");
    *value = (REF_SIZE)long_value;
  }
  return REF_SUCCESS;
}